

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

bool __thiscall
helics::PublicationInfo::addSubscriber
          (PublicationInfo *this,GlobalHandle newSubscriber,string_view subscriberName)

{
  SubscriberInformation *sub;
  pointer pSVar1;
  GlobalHandle local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = subscriberName._M_str;
  local_10._M_len = subscriberName._M_len;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pSVar1 == (this->subscribers).
                  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_18 = newSubscriber;
      std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>
                  *)&this->subscribers,&local_18,&local_10);
      return true;
    }
    if (((pSVar1->id).fed_id.gid == newSubscriber.fed_id.gid.gid) &&
       ((pSVar1->id).handle.hid == newSubscriber.handle.hid.hid)) break;
    pSVar1 = pSVar1 + 1;
  }
  return false;
}

Assistant:

bool PublicationInfo::addSubscriber(GlobalHandle newSubscriber, std::string_view subscriberName)
{
    for (auto& sub : subscribers) {
        if (sub.id == newSubscriber) {
            return false;
        }
    }
    subscribers.emplace_back(newSubscriber, subscriberName);
    return true;
}